

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_transaction.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_>::
key(transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this,string *s)

{
  int iVar1;
  not_null<pstore::exchange::import_ns::string_mapping_*> args_1;
  error_code eVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  if (iVar1 == 0) {
    args_1.ptr_ = (this->names_).ptr_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 == 0) {
        eVar2 = rule::
                push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::debug_line_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*>
                          (&this->super_rule,&this->transaction_);
        return eVar2;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 != 0) {
          eVar2 = make_error_code(unknown_transaction_object_key);
          return eVar2;
        }
        eVar2 = rule::
                push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
                          (&this->super_rule,&this->transaction_,(this->names_).ptr_);
        return eVar2;
      }
      eVar2 = rule::
              push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
                        (&this->super_rule,&this->transaction_,(this->names_).ptr_);
      return eVar2;
    }
    args_1.ptr_ = (this->paths_).ptr_;
  }
  eVar2 = rule::
          push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>
                    (&this->super_rule,&this->transaction_,args_1);
  return eVar2;
}

Assistant:

std::error_code transaction_contents<TransactionLock>::key (std::string const & s) {
                // TODO: check that "names" is the first key that we see.
                if (s == "names") {
                    return push_array_rule<strings_array_members> (this, &transaction_, names_);
                }
                if (s == "paths") {
                    return push_array_rule<strings_array_members> (this, &transaction_, paths_);
                }
                if (s == "debugline") {
                    return push_object_rule<debug_line_index> (this, &transaction_);
                }
                if (s == "fragments") {
                    return push_object_rule<fragment_index> (this, &transaction_, names_.get ());
                }
                if (s == "compilations") {
                    return push_object_rule<compilations_index> (this, &transaction_,
                                                                 names_.get ());
                }
                return error::unknown_transaction_object_key;
            }